

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O3

void JsrtDebugUtils::AddSourceToObject(DynamicObject *object,Utf8SourceInfo *utf8SourceInfo)

{
  Type TVar1;
  int iVar2;
  HeapAllocator *this;
  type_info *ptVar3;
  size_t sVar4;
  undefined1 local_60 [8];
  TrackAllocData data;
  AutoArrayPtr<char16_t> sourceContent;
  
  TVar1 = utf8SourceInfo->m_cchLength;
  iVar2 = TVar1 + 1;
  local_60 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_21faa6;
  data.filename._0_4_ = 0x61;
  data.plusSize = (long)iVar2;
  this = Memory::HeapAllocator::TrackAllocInfo
                   (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
  sVar4 = 0xffffffffffffffff;
  if (-1 < iVar2) {
    sVar4 = (long)iVar2 * 2;
  }
  data._32_8_ = Memory::HeapAllocator::AllocT<true>(this,sVar4);
  if ((char *)data._32_8_ == (char *)0x0) {
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x1c,L"",1,(utf8SourceInfo->m_scriptContext).ptr
                       );
  }
  else {
    ptVar3 = (type_info *)Js::Utf8SourceInfo::GetSource(utf8SourceInfo,(char16 *)0x0);
    local_60 = (undefined1  [8])ptVar3;
    sVar4 = Js::Utf8SourceInfo::GetCbLength(utf8SourceInfo,(char16 *)0x0);
    utf8::DecodeUnitsIntoAndNullTerminate
              ((char16 *)data._32_8_,(LPCUTF8 *)local_60,(LPCUTF8)(ptVar3 + sVar4),
               *(uint *)&utf8SourceInfo->field_0xa8 >> 1 & doAllowThreeByteSurrogates,(bool *)0x0);
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x1c,(char16 *)data._32_8_,(long)(int)TVar1,
                        (utf8SourceInfo->m_scriptContext).ptr);
  }
  AutoArrayPtr<char16_t>::~AutoArrayPtr((AutoArrayPtr<char16_t> *)&data.line);
  return;
}

Assistant:

void JsrtDebugUtils::AddSourceToObject(Js::DynamicObject * object, Js::Utf8SourceInfo * utf8SourceInfo)
{
    int32 cchLength = utf8SourceInfo->GetCchLength();
    AutoArrayPtr<char16> sourceContent(HeapNewNoThrowArray(char16, cchLength + 1), cchLength + 1);
    if (sourceContent != nullptr)
    {
        LPCUTF8 source = utf8SourceInfo->GetSource();
        size_t cbLength = utf8SourceInfo->GetCbLength();
        utf8::DecodeOptions options = utf8SourceInfo->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
        utf8::DecodeUnitsIntoAndNullTerminate(sourceContent, source, source + cbLength, options);
        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::source, sourceContent, cchLength, utf8SourceInfo->GetScriptContext());
    }
    else
    {
        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::source, _u(""), 1, utf8SourceInfo->GetScriptContext());
    }
}